

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O2

int Sbd_ProblemSolve(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                    Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,Vec_Int_t *vDivSet,
                    int nStrs,Sbd_Str_t *pStr0)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  sat_solver *s;
  undefined4 extraout_var;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iLit;
  sat_solver *local_870;
  ulong local_868;
  Vec_Int_t *local_860;
  Vec_Int_t *local_858;
  ulong local_850;
  ulong local_848;
  ulong local_840;
  int pVarsQbf [256];
  int pVarsCec [256];
  
  local_870 = (sat_solver *)vObj2Var;
  clock_gettime(3,(timespec *)pVarsCec);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  local_860 = vTfo;
  local_858 = pVVar6;
  local_870 = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,Pivot,vWinObjs,(Vec_Int_t *)local_870,
                               vTfo,vRoots,1);
  s = sat_solver_new();
  iVar12 = vDivSet->nSize;
  uVar13 = (ulong)iVar12;
  iVar2 = Sbd_ProblemCountParams(nStrs,pStr0);
  local_848 = CONCAT44(extraout_var,iVar2);
  if (10 < (long)uVar13) {
    __assert_fail("Vec_IntSize(vDivSet) <= SBD_DIV_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                  ,0xd6,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  uVar11 = iVar12 + nStrs;
  if (0x100 < (int)(iVar2 + uVar11)) {
    __assert_fail("nVars + nStrs + nPars <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                  ,0xd7,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  local_850 = (ulong)(uint)local_860->nSize;
  iVar12 = vRoots->nSize;
  uVar3 = vWinObjs->nSize + local_860->nSize + iVar12;
  local_840 = (ulong)uVar3;
  iVar2 = uVar3 + nStrs;
  local_868 = uVar13;
  local_860 = (Vec_Int_t *)(ulong)(uint)vWinObjs->nSize;
  for (lVar10 = 0; lVar10 < (int)uVar13; lVar10 = lVar10 + 1) {
    iVar4 = Vec_IntEntry(vDivSet,(int)lVar10);
    pVarsCec[lVar10] = iVar4;
    uVar13 = (ulong)(uint)vDivSet->nSize;
  }
  uVar13 = 0;
  uVar8 = 0;
  if (0 < nStrs) {
    uVar8 = (ulong)(uint)nStrs;
  }
  for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
    pVarsCec[local_868 + uVar13] = (int)local_860 + iVar12 + (int)local_850 + (int)uVar13;
  }
  uVar8 = 0;
  uVar13 = local_848 & 0xffffffff;
  if ((int)local_848 < 1) {
    uVar13 = uVar8;
  }
  iVar12 = iVar12 + (int)local_850 + (int)local_860 + nStrs;
  for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    pVarsCec[(long)(int)uVar11 + uVar8] = (int)uVar8 + iVar12;
  }
  uVar9 = 0;
  uVar8 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pVarsQbf[uVar9] = -1;
  }
  for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
    pVarsQbf[(long)(int)uVar11 + uVar9] = (int)uVar9;
  }
  Sbd_ProblemAddClauses(local_870,(int)local_868,nStrs,pVarsCec,pStr0);
  sat_solver_setnvars(s,1000);
  Sbd_ProblemAddClausesInit(s,(int)local_868,nStrs,pVarsQbf,pStr0);
  local_858->nSize = 0;
  iVar4 = (int)uVar13;
  while (iVar5 = (int)uVar13, uVar13 = (ulong)(iVar5 - 1), iVar5 != 0) {
    iVar5 = Abc_Var2Lit(iVar2,1);
    Vec_IntPush(local_858,iVar5);
    iVar2 = iVar2 + 1;
  }
  bVar1 = (byte)local_868 & 0x1f;
  iVar2 = 1 << bVar1;
  uVar13 = 0;
  if (1 << bVar1 < 1) {
    iVar2 = 0;
  }
  local_850 = CONCAT44(local_850._4_4_,iVar2);
  do {
    pVVar6 = local_858;
    iVar2 = local_858->nSize;
    if ((int)uVar13 == (int)local_850) {
LAB_0045d01a:
      if (iVar2 < 1) {
LAB_0045d03c:
        iVar2 = 0;
      }
      else {
        Sbd_ProblemCollectSolution(nStrs,pStr0,pVVar6);
        iVar2 = 1;
      }
LAB_0045d049:
      sat_solver_delete(local_870);
      sat_solver_delete(s);
      free(pVVar6->pArray);
      free(pVVar6);
      return iVar2;
    }
    local_860 = (Vec_Int_t *)uVar13;
    iVar5 = sat_solver_solve(local_870,local_858->pArray,local_858->pArray + iVar2,0,0,0,0);
    if (iVar5 != 1) {
      if (iVar5 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,0xf8,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      goto LAB_0045d01a;
    }
    pVVar6->nSize = 0;
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      pVarsQbf[uVar13] = (int)local_848 + (int)uVar13;
    }
    local_848 = (local_848 & 0xffffffff) + uVar13;
    lVar10 = 0;
    while (uVar13 = local_868, lVar10 < vDivSet->nSize) {
      iVar5 = Vec_IntEntry(vDivSet,(int)lVar10);
      iVar2 = pVarsQbf[lVar10];
      uVar11 = sat_solver_var_value(local_870,iVar5);
      iLit = Abc_Var2Lit(iVar2,uVar11 ^ 1);
      iVar2 = sat_solver_addclause(s,&iLit,(lit *)&local_870);
      lVar10 = lVar10 + 1;
      if (iVar2 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,0x10b,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
    }
    iVar2 = pVarsQbf[local_868];
    iVar5 = sat_solver_var_value(local_870,(int)local_840);
    iLit = Abc_Var2Lit(iVar2,iVar5);
    iVar2 = sat_solver_addclause(s,&iLit,(lit *)&local_870);
    pVVar6 = local_858;
    if (iVar2 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                    ,0x111,
                    "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                   );
    }
    iVar2 = Sbd_ProblemAddClauses(s,(int)uVar13,nStrs,pVarsQbf,pStr0);
    if (iVar2 == 0) goto LAB_0045d03c;
    iVar2 = 0;
    iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar5 != 1) {
      if (iVar5 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                      ,0x11b,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      goto LAB_0045d049;
    }
    for (iVar2 = 0; iVar4 != iVar2; iVar2 = iVar2 + 1) {
      uVar11 = sat_solver_var_value(s,iVar2);
      iVar5 = Abc_Var2Lit(iVar2 + iVar12,uVar11 ^ 1);
      Vec_IntPush(local_858,iVar5);
    }
    uVar13 = (ulong)((int)local_860 + 1);
  } while( true );
}

Assistant:

int Sbd_ProblemSolve( Gia_Man_t * p, Vec_Int_t * vMirrors, 
                       int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                       Vec_Int_t * vTfo, Vec_Int_t * vRoots, 
                       Vec_Int_t * vDivSet, int nStrs, Sbd_Str_t * pStr0 )  // divisors, structures
{
    extern sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf );
    
    int fVerbose = 0;
    abctime clk = Abc_Clock();
    Vec_Int_t * vLits    = Vec_IntAlloc( 100 );
    sat_solver * pSatCec = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 1 );
    sat_solver * pSatQbf = sat_solver_new();

    int nVars      = Vec_IntSize( vDivSet );
    int nPars      = Sbd_ProblemCountParams( nStrs, pStr0 );

    int VarCecOut  = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int VarCecPar  = VarCecOut + nStrs;

    int VarQbfPar  = 0;
    int VarQbfFree = nPars;

    int pVarsCec[256];
    int pVarsQbf[256];
    int i, iVar, iLit, nIters;
    int RetValue = 0;

    assert( Vec_IntSize(vDivSet) <= SBD_DIV_MAX );
    assert( nVars + nStrs + nPars <= 256 );

    // collect CEC variables
    Vec_IntForEachEntry( vDivSet, iVar, i )
        pVarsCec[i] = iVar;
    for ( i = 0; i < nStrs; i++ )
        pVarsCec[nVars + i] = VarCecOut + i;
    for ( i = 0; i < nPars; i++ )
        pVarsCec[nVars + nStrs + i] = VarCecPar + i;

    // collect QBF variables
    for ( i = 0; i < nVars + nStrs; i++ )
        pVarsQbf[i] = -1;
    for ( i = 0; i < nPars; i++ )
        pVarsQbf[nVars + nStrs + i] = VarQbfPar + i;

    // add clauses to the CEC problem
    Sbd_ProblemAddClauses( pSatCec, nVars, nStrs, pVarsCec, pStr0 );

    // create QBF solver
    sat_solver_setnvars( pSatQbf, 1000 );
    Sbd_ProblemAddClausesInit( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 );

    // assume all parameter variables are 0
    Vec_IntClear( vLits );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, 1) );
    for ( nIters = 0; nIters < (1 << nVars); nIters++ )
    {
        // check if these parameters solve the problem
        int status = sat_solver_solve( pSatCec, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        if ( status == l_False ) // solution found
            break;
        assert( status == l_True );

        if ( fVerbose )
        {
            printf( "Iter %3d : ", nIters );
            for ( i = 0; i < nPars; i++ )
                printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) );
            printf( "    " );
        }

        Vec_IntClear( vLits );
        // create new QBF variables
        for ( i = 0; i < nVars + nStrs; i++ )
            pVarsQbf[i] = VarQbfFree++;
        // set their values
        Vec_IntForEachEntry( vDivSet, iVar, i )
        {
            iLit = Abc_Var2Lit( pVarsQbf[i], !sat_solver_var_value(pSatCec, iVar) );
            status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
            assert( status );
            if ( fVerbose )
                printf( "%d", sat_solver_var_value(pSatCec, iVar) );
        }
        iLit = Abc_Var2Lit( pVarsQbf[nVars], sat_solver_var_value(pSatCec, VarCecOut) );
        status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
        assert( status );
        if ( fVerbose )
            printf( " %d\n", !sat_solver_var_value(pSatCec, VarCecOut) );
        // add clauses to the QBF problem
        if ( !Sbd_ProblemAddClauses( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 ) )
            break; // solution does not exist
        // check if solution still exists
        status = sat_solver_solve( pSatQbf, NULL, NULL, 0, 0, 0, 0 );
        if ( status == l_False ) // solution does not exist
            break;
        assert( status == l_True ); 
        // find the new values of parameters
        assert( Vec_IntSize(vLits) == 0 );
        for ( i = 0; i < nPars; i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, !sat_solver_var_value(pSatQbf, VarQbfPar + i)) );
    }
    if ( Vec_IntSize(vLits) > 0 )
    {
        //Sbd_ProblemPrintSolution( nStrs, pStr0, vLits );
        Sbd_ProblemCollectSolution( nStrs, pStr0, vLits );
        RetValue = 1;
    }
    sat_solver_delete( pSatCec );
    sat_solver_delete( pSatQbf );
    Vec_IntFree( vLits );

    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}